

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFEmitter.cpp
# Opt level: O2

void writeInitialLength(InitialLength *Length,raw_ostream *OS,bool IsLittleEndian)

{
  writeInteger<unsigned_int>(Length->TotalLength,OS,IsLittleEndian);
  if (Length->TotalLength != 0xffffffff) {
    return;
  }
  writeInteger<unsigned_long>(Length->TotalLength64,OS,IsLittleEndian);
  return;
}

Assistant:

static void writeInitialLength(const DWARFYAML::InitialLength &Length,
                               raw_ostream &OS, bool IsLittleEndian) {
  writeInteger((uint32_t)Length.TotalLength, OS, IsLittleEndian);
  if (Length.isDWARF64())
    writeInteger((uint64_t)Length.TotalLength64, OS, IsLittleEndian);
}